

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Request * __thiscall
kj::anon_unknown_31::ConcurrencyLimitingHttpClient::request
          (Request *__return_storage_ptr__,ConcurrencyLimitingHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseNode *pPVar1;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  char *pcVar3;
  TransformPromiseNodeBase *this_00;
  int __flags;
  Maybe<unsigned_long> *pMVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Disposer *pDVar5;
  void *pvVar6;
  void *__arg;
  size_t sVar7;
  Promise<kj::HttpClient::Response> PVar8;
  Own<kj::(anonymous_namespace)::PromiseOutputStream> OVar9;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3979:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  combined;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  String urlCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  split;
  HttpHeaders headersCopy;
  Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  local_198;
  Own<kj::_::PromiseNode> local_188;
  value_type local_178;
  String local_168;
  SplitTuplePromise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
  local_148;
  ArrayDisposer *pAStack_128;
  HttpHeaders local_120;
  char local_c0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_b8;
  Disposer *local_b0;
  AsyncOutputStream *local_a8;
  HttpHeaders local_a0;
  char local_40 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_38;
  
  pvVar6 = (void *)url.content.size_;
  if (this->concurrentRequests < this->maxConcurrentRequests) {
    this->concurrentRequests = this->concurrentRequests + 1;
    local_40[0] = (expectedBodySize->ptr).isSet;
    if ((bool)local_40[0] == true) {
      local_38 = (expectedBodySize->ptr).field_1;
    }
    local_188.disposer = (Disposer *)this;
    (**this->inner->_vptr_HttpClient)
              (&local_148,this->inner,(ulong)method,url.content.ptr,pvVar6,headers,local_40);
    fireCountChanged(this);
    PVar8 = attachCounter((ConcurrencyLimitingHttpClient *)&local_a0,
                          &local_148.impl.
                           super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value,
                          (ConnectionCounter *)&local_188);
    pPVar1 = local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.ptr;
    (__return_storage_ptr__->body).disposer =
         local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.disposer;
    (__return_storage_ptr__->body).ptr =
         (AsyncOutputStream *)
         local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.ptr;
    local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (__return_storage_ptr__->response).super_PromiseBase.node.disposer = (Disposer *)local_a0.table;
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         (PromiseNode *)local_a0.indexedHeaders.ptr;
    if (local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
        super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
          super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value
                 .super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,
                 PVar8.super_PromiseBase.node.ptr);
    }
    pPVar1 = local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
             value.super_PromiseBase.node.ptr;
    if (local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
        super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value
          .super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_148.impl.
                 super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                 super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    }
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_188);
  }
  else {
    pMVar4 = expectedBodySize;
    __arg = pvVar6;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              ();
    __flags = (int)pMVar4;
    sVar7 = (long)pvVar6 - 1;
    heapString(&local_168,sVar7);
    pvVar6 = extraout_RDX;
    if (sVar7 != 0) {
      pDVar5 = (Disposer *)local_168.content.size_;
      if ((Disposer *)local_168.content.size_ != (Disposer *)0x0) {
        pDVar5 = (Disposer *)local_168.content.ptr;
      }
      memcpy(pDVar5,url.content.ptr,sVar7);
      pvVar6 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_a0,(__fn *)headers,pvVar6,__flags,__arg);
    local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.ptr =
         (PromiseNode *)
         CONCAT44(local_148.impl.
                  super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                  super_PromiseBase.node.ptr._4_4_,method);
    local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)local_168.content.ptr;
    local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)local_168.content.size_;
    pAStack_128 = local_168.content.disposer;
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    local_120.table = local_a0.table;
    local_120.indexedHeaders.ptr = local_a0.indexedHeaders.ptr;
    local_120.indexedHeaders.size_ = local_a0.indexedHeaders.size_;
    local_120.indexedHeaders.disposer = local_a0.indexedHeaders.disposer;
    local_a0.indexedHeaders.ptr = (StringPtr *)0x0;
    local_a0.indexedHeaders.size_ = 0;
    local_120.unindexedHeaders.builder.ptr = local_a0.unindexedHeaders.builder.ptr;
    local_120.unindexedHeaders.builder.pos = local_a0.unindexedHeaders.builder.pos;
    local_120.unindexedHeaders.builder.endPtr = local_a0.unindexedHeaders.builder.endPtr;
    local_120.unindexedHeaders.builder.disposer = local_a0.unindexedHeaders.builder.disposer;
    local_a0.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_a0.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_a0.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_120.ownedStrings.builder.ptr = local_a0.ownedStrings.builder.ptr;
    local_120.ownedStrings.builder.pos = local_a0.ownedStrings.builder.pos;
    local_120.ownedStrings.builder.endPtr = local_a0.ownedStrings.builder.endPtr;
    local_120.ownedStrings.builder.disposer = local_a0.ownedStrings.builder.disposer;
    local_a0.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_a0.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_a0.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_c0 = (expectedBodySize->ptr).isSet;
    if ((bool)local_c0 == true) {
      local_b8 = (expectedBodySize->ptr).field_1;
    }
    local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)this;
    this_00 = (TransformPromiseNodeBase *)operator_new(0xc0);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_188,
               _::
               TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3979:15),_kj::_::PropagateException>
               ::anon_class_152_5_1d7fcda0_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00462768;
    this_00[1].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)
         local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.disposer;
    *(undefined4 *)&this_00[1].dependency.disposer =
         local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
         super_PromiseBase.node.ptr._0_4_;
    this_00[1].dependency.ptr =
         (PromiseNode *)
         local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.disposer;
    this_00[1].continuationTracePtr =
         local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.ptr;
    this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pAStack_128;
    local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.disposer = (Disposer *)0x0;
    local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    this_00[2].dependency.disposer = (Disposer *)local_120.table;
    this_00[2].dependency.ptr = (PromiseNode *)local_120.indexedHeaders.ptr;
    this_00[2].continuationTracePtr = (void *)local_120.indexedHeaders.size_;
    this_00[3].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_120.indexedHeaders.disposer
    ;
    local_120.indexedHeaders.ptr = (StringPtr *)0x0;
    local_120.indexedHeaders.size_ = 0;
    this_00[3].dependency.disposer = (Disposer *)local_120.unindexedHeaders.builder.ptr;
    this_00[3].dependency.ptr = (PromiseNode *)local_120.unindexedHeaders.builder.pos;
    this_00[3].continuationTracePtr = local_120.unindexedHeaders.builder.endPtr;
    this_00[4].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)local_120.unindexedHeaders.builder.disposer;
    local_120.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_120.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_120.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    this_00[4].dependency.disposer = (Disposer *)local_120.ownedStrings.builder.ptr;
    this_00[4].dependency.ptr = (PromiseNode *)local_120.ownedStrings.builder.pos;
    this_00[4].continuationTracePtr = local_120.ownedStrings.builder.endPtr;
    this_00[5].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)local_120.ownedStrings.builder.disposer;
    local_120.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_120.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_120.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    *(char *)&this_00[5].dependency.disposer = local_c0;
    if (local_c0 == '\x01') {
      this_00[5].dependency.ptr = (PromiseNode *)local_b8;
    }
    local_198.super_PromiseBase.node.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1},kj::_::PropagateException>>
          ::instance;
    local_198.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
    HttpHeaders::~HttpHeaders(&local_120);
    pPVar1 = local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.ptr;
    pDVar5 = local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
             super_PromiseBase.node.disposer;
    if (local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
        super_PromiseBase.node.disposer != (Disposer *)0x0) {
      local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.disposer = (Disposer *)0x0;
      local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**pAStack_128->_vptr_ArrayDisposer)(pAStack_128,pDVar5,1,pPVar1,pPVar1,0);
    }
    Promise<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
    split(&local_148,&local_198);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>_>_>_>_>
    ::push(&this->pendingRequests,&local_178);
    fireCountChanged(this);
    OVar9 = heap<kj::(anonymous_namespace)::PromiseOutputStream,kj::Promise<kj::Own<kj::AsyncOutputStream>>>
                      ((kj *)&local_b0,(Promise<kj::Own<kj::AsyncOutputStream>_> *)&local_148);
    pPVar1 = local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
             value.super_PromiseBase.node.ptr;
    (__return_storage_ptr__->body).disposer = local_b0;
    (__return_storage_ptr__->body).ptr = local_a8;
    local_a8 = (AsyncOutputStream *)0x0;
    (__return_storage_ptr__->response).super_PromiseBase.node.disposer =
         local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.disposer;
    (__return_storage_ptr__->response).super_PromiseBase.node.ptr =
         local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
         super_PromiseBase.node.ptr;
    local_148.impl.super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    if (local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
        super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**((HttpClient *)
         &(local_148.impl.super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.
           value.super_PromiseBase.node.disposer)->_vptr_Disposer)->_vptr_HttpClient)
                (local_148.impl.
                 super_TupleElement<0U,_kj::Promise<kj::Own<kj::AsyncOutputStream>_>_>.value.
                 super_PromiseBase.node.disposer,
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,OVar9.ptr);
    }
    pPVar1 = local_198.super_PromiseBase.node.ptr;
    if ((TransformPromiseNodeBase *)local_198.super_PromiseBase.node.ptr !=
        (TransformPromiseNodeBase *)0x0) {
      local_198.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_198.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_198.super_PromiseBase.node.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    HttpHeaders::~HttpHeaders(&local_a0);
    sVar7 = local_168.content.size_;
    pcVar3 = local_168.content.ptr;
    if (local_168.content.ptr != (char *)0x0) {
      local_168.content.ptr = (char *)0x0;
      local_168.content.size_ = 0;
      (**(local_168.content.disposer)->_vptr_ArrayDisposer)
                (local_168.content.disposer,pcVar3,1,sVar7,sVar7,0);
    }
    pPVar2 = local_178.ptr;
    if (local_178.ptr !=
        (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
         *)0x0) {
      local_178.ptr =
           (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)0x0;
      (**(local_178.disposer)->_vptr_Disposer)
                (local_178.disposer,
                 pPVar2->_vptr_PromiseFulfiller[-2] + (long)&pPVar2->_vptr_PromiseFulfiller);
    }
    pPVar1 = local_188.ptr;
    if (local_188.ptr != (PromiseNode *)0x0) {
      local_188.ptr = (PromiseNode *)0x0;
      (**(local_188.disposer)->_vptr_Disposer)
                (local_188.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode
                );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto request = inner.request(method, url, headers, expectedBodySize);
      fireCountChanged();
      auto promise = attachCounter(kj::mv(request.response), kj::mv(counter));
      return { kj::mv(request.body), kj::mv(promise) };
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto combined = paf.promise
        .then([this,
               method,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy),
               expectedBodySize](ConnectionCounter&& counter) mutable {
      auto req = inner.request(method, urlCopy, headersCopy, expectedBodySize);
      return kj::tuple(kj::mv(req.body), attachCounter(kj::mv(req.response), kj::mv(counter)));
    });
    auto split = combined.split();
    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return { kj::heap<PromiseOutputStream>(kj::mv(kj::get<0>(split))), kj::mv(kj::get<1>(split)) };
  }